

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O3

void genxDispose(genxWriter w)

{
  void **ppvVar1;
  void **ppvVar2;
  void **ppvVar3;
  void **ppvVar4;
  utf8 __ptr;
  long lVar5;
  void *pvVar6;
  
  ppvVar1 = (w->elements).pointers;
  ppvVar2 = (w->attributes).pointers;
  ppvVar3 = (w->prefixes).pointers;
  if (0 < (w->namespaces).count) {
    ppvVar4 = (w->namespaces).pointers;
    lVar5 = 0;
    do {
      pvVar6 = *(void **)((long)ppvVar4[lVar5] + 8);
      if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
        if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
          free(pvVar6);
          goto LAB_001d559a;
        }
      }
      else {
        (*w->dealloc)(w->userData,pvVar6);
LAB_001d559a:
        pvVar6 = ppvVar4[lVar5];
        if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
          if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
            free(pvVar6);
          }
        }
        else {
          (*w->dealloc)(w->userData,pvVar6);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (w->namespaces).count);
  }
  if (0 < (w->elements).count) {
    lVar5 = 0;
    do {
      pvVar6 = *(void **)((long)ppvVar1[lVar5] + 8);
      if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
        if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
          free(pvVar6);
          goto LAB_001d5614;
        }
      }
      else {
        (*w->dealloc)(w->userData,pvVar6);
LAB_001d5614:
        pvVar6 = ppvVar1[lVar5];
        if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
          if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
            free(pvVar6);
          }
        }
        else {
          (*w->dealloc)(w->userData,pvVar6);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (w->elements).count);
  }
  if (0 < (w->attributes).count) {
    lVar5 = 0;
    do {
      if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
        if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
          free(*(void **)((long)ppvVar2[lVar5] + 8));
          goto LAB_001d5691;
        }
        pvVar6 = *(void **)((long)ppvVar2[lVar5] + 0x18);
LAB_001d56c2:
        if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
          free(pvVar6);
        }
      }
      else {
        (*w->dealloc)(w->userData,*(void **)((long)ppvVar2[lVar5] + 8));
LAB_001d5691:
        pvVar6 = *(void **)((long)ppvVar2[lVar5] + 0x18);
        if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) goto LAB_001d56c2;
        (*w->dealloc)(w->userData,pvVar6);
      }
      if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
        if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
          free(ppvVar2[lVar5]);
        }
      }
      else {
        (*w->dealloc)(w->userData,ppvVar2[lVar5]);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (w->attributes).count);
  }
  if (0 < (w->prefixes).count) {
    lVar5 = 0;
    do {
      pvVar6 = ppvVar3[lVar5];
      if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
        if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
          free(pvVar6);
        }
      }
      else {
        (*w->dealloc)(w->userData,pvVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (w->prefixes).count);
  }
  ppvVar1 = (w->namespaces).pointers;
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(ppvVar1);
    }
  }
  else {
    (*w->dealloc)(w->userData,ppvVar1);
  }
  ppvVar1 = (w->elements).pointers;
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(ppvVar1);
    }
  }
  else {
    (*w->dealloc)(w->userData,ppvVar1);
  }
  ppvVar1 = (w->attributes).pointers;
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(ppvVar1);
    }
  }
  else {
    (*w->dealloc)(w->userData,ppvVar1);
  }
  ppvVar1 = (w->prefixes).pointers;
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(ppvVar1);
    }
  }
  else {
    (*w->dealloc)(w->userData,ppvVar1);
  }
  ppvVar1 = (w->stack).pointers;
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(ppvVar1);
    }
  }
  else {
    (*w->dealloc)(w->userData,ppvVar1);
  }
  __ptr = (w->arec).value.buf;
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(__ptr);
    }
  }
  else {
    (*w->dealloc)(w->userData,__ptr);
  }
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(w->empty);
    }
  }
  else {
    (*w->dealloc)(w->userData,w->empty);
  }
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(w);
      return;
    }
    return;
  }
  (*w->dealloc)(w->userData,w);
  return;
}

Assistant:

void genxDispose(genxWriter w)
{
  int i;
  genxNamespace * nn = (genxNamespace *) w->namespaces.pointers;
  genxElement * ee = (genxElement *) w->elements.pointers;
  genxAttribute * aa = (genxAttribute *) w->attributes.pointers;
  utf8 * pp = (utf8 *) w->prefixes.pointers;

  for (i = 0; i < w->namespaces.count; i++)
  {
    deallocate(w, nn[i]->name);
    deallocate(w, nn[i]);
  }

  for (i = 0; i < w->elements.count; i++)
  {
    deallocate(w, ee[i]->type);
    deallocate(w, ee[i]);
  }

  for (i = 0; i < w->attributes.count; i++)
  {
    deallocate(w, aa[i]->name);
    deallocate(w, aa[i]->value.buf);
    deallocate(w, aa[i]);
  }

  for(i = 0; i < w->prefixes.count; i++)
    deallocate(w, pp[i]);

  deallocate(w, w->namespaces.pointers);
  deallocate(w, w->elements.pointers);
  deallocate(w, w->attributes.pointers);
  deallocate(w, w->prefixes.pointers);
  deallocate(w, w->stack.pointers);

  deallocate(w, w->arec.value.buf);

  deallocate(w, w->empty);

  /* how Oscar dealt with Igli */
  deallocate(w, w);
}